

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

int lyd_list_equal(lyd_node *node1,lyd_node *node2,int with_defaults)

{
  LYS_NODE LVar1;
  ly_ctx *ctx;
  ly_ctx *plVar2;
  int iVar3;
  lys_node *plVar4;
  lys_node *plVar5;
  lyd_node *plVar6;
  lys_module *plVar7;
  byte bVar8;
  lyd_node *plVar9;
  lyd_node *plVar10;
  uint diff_ctx;
  lyd_node **pplVar11;
  lyd_node *plVar12;
  char *pcVar13;
  char *pcVar14;
  uint uVar15;
  lyd_node **pplVar16;
  bool bVar17;
  
  ctx = node2->schema->module->ctx;
  plVar2 = node1->schema->module->ctx;
  LVar1 = node2->schema->nodetype;
  diff_ctx = (uint)(plVar2 != ctx);
  if (LVar1 == LYS_LIST) {
    if (node1->schema->padding[2] != '\0') {
      if (node1->schema->padding[2] == '\0') {
        uVar15 = 0;
      }
      else {
        pplVar16 = &node2->child;
        pplVar11 = &node1->child;
        plVar4 = (lys_node *)0x0;
        uVar15 = 0;
        while( true ) {
          plVar10 = *pplVar16;
          plVar12 = *pplVar11;
          if (plVar12 != (lyd_node *)0x0 && plVar2 != ctx) {
            if (plVar4 == (lys_node *)0x0) {
              plVar4 = lys_get_schema_inctx(plVar12->schema,ctx);
              if (plVar4 == (lys_node *)0x0) {
                plVar7 = plVar12->schema->module;
                if ((plVar7->field_0x40 & 1) != 0) {
                  plVar7 = (lys_module *)plVar7->data;
                }
                pcVar13 = plVar7->name;
                pcVar14 = plVar12->schema->name;
                goto LAB_00165fe9;
              }
            }
            else {
              plVar4 = plVar4->next;
            }
          }
          if ((plVar12 == (lyd_node *)0x0) || (plVar10 == (lyd_node *)0x0)) break;
          plVar5 = plVar4;
          if (plVar4 == (lys_node *)0x0) {
            plVar5 = plVar12->schema;
          }
          if ((plVar5 != plVar10->schema) ||
             (iVar3 = lyd_leaf_val_equal(plVar12,plVar10,diff_ctx), iVar3 == 0)) break;
          pplVar11 = &plVar12->next;
          pplVar16 = &plVar10->next;
          uVar15 = uVar15 + 1;
          if (node1->schema->padding[2] <= uVar15) break;
        }
      }
      if (uVar15 != node1->schema->padding[2]) {
        return 0;
      }
      return 1;
    }
    plVar10 = node1->child;
    if ((plVar10 == (lyd_node *)0x0) && (node2->child == (lyd_node *)0x0)) {
      return 1;
    }
    bVar17 = plVar10 != (lyd_node *)0x0;
    bVar8 = node2->child != (lyd_node *)0x0;
    plVar12 = node2->child;
    if (bVar17 && (bool)bVar8) {
      while (plVar10->hash == plVar12->hash) {
        plVar4 = plVar10->schema;
        if ((plVar2 != ctx) &&
           (plVar4 = lys_get_schema_inctx(plVar4,ctx), plVar4 == (lys_node *)0x0)) {
          plVar7 = plVar10->schema->module;
          if ((plVar7->field_0x40 & 1) != 0) {
            plVar7 = (lys_module *)plVar7->data;
          }
          pcVar13 = plVar7->name;
          pcVar14 = plVar10->schema->name;
LAB_00165fe9:
          ly_log(ctx,LY_LLERR,LY_EINVAL,
                 "Target context does not contain a required schema node (%s:%s).",pcVar13,pcVar14);
          return -1;
        }
        if (plVar4 != plVar12->schema) break;
        LVar1 = plVar12->schema->nodetype;
        if (LVar1 == LYS_LIST) {
          iVar3 = lyd_list_has_keys(plVar10);
          if ((iVar3 != 0) || (iVar3 = lyd_list_has_keys(plVar12), iVar3 != 0)) goto LAB_00165ec5;
LAB_00165ed3:
          plVar9 = (lyd_node *)0x0;
          plVar6 = (lyd_node *)0x0;
        }
        else {
          if ((LVar1 & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
            if (((LVar1 & LYS_ANYDATA) != LYS_UNKNOWN) &&
               (iVar3 = lyd_anydata_equal(plVar10,plVar12), iVar3 == 0)) break;
          }
          else {
            iVar3 = lyd_leaf_val_equal(plVar10,plVar12,diff_ctx);
            if ((iVar3 == 0) &&
               ((with_defaults == 0 || (((plVar12->field_0x9 ^ plVar10->field_0x9) & 1) == 0))))
            break;
          }
LAB_00165ec5:
          if ((plVar12->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN)
          goto LAB_00165ed3;
          plVar9 = plVar10->child;
          plVar6 = plVar12->child;
        }
        if (plVar9 == (lyd_node *)0x0) {
          plVar9 = plVar10->next;
        }
        if (plVar6 == (lyd_node *)0x0) {
          plVar6 = plVar12->next;
        }
        if (plVar9 == (lyd_node *)0x0) {
          for (plVar10 = plVar10->parent;
              (plVar10 != node1 && (plVar9 = plVar10->next, plVar9 == (lyd_node *)0x0));
              plVar10 = plVar10->parent) {
          }
        }
        if (plVar6 == (lyd_node *)0x0) {
          for (plVar10 = plVar12->parent;
              (plVar10 != node2 && (plVar6 = plVar10->next, plVar6 == (lyd_node *)0x0));
              plVar10 = plVar10->parent) {
          }
        }
        bVar8 = plVar6 != (lyd_node *)0x0;
        bVar17 = plVar9 != (lyd_node *)0x0;
        if ((plVar9 == (lyd_node *)0x0) ||
           (plVar12 = plVar6, plVar10 = plVar9, plVar6 == (lyd_node *)0x0)) break;
      }
    }
    if (bVar17) {
      return 0;
    }
  }
  else {
    if (LVar1 != LYS_LEAFLIST) {
      ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
             ,0x113);
      return -1;
    }
    iVar3 = lyd_leaf_val_equal(node1,node2,diff_ctx);
    if (iVar3 == 0) {
      return 0;
    }
    if (with_defaults == 0) {
      return 1;
    }
    bVar8 = node2->field_0x9 ^ node1->field_0x9;
  }
  if ((bVar8 & 1) != 0) {
    return 0;
  }
  return 1;
}

Assistant:

int
lyd_list_equal(struct lyd_node *node1, struct lyd_node *node2, int with_defaults)
{
    int i, diff_ctx;
    struct lyd_node *elem1, *next1, *elem2, *next2;
    struct lys_node *elem1_sch;
    struct ly_ctx *ctx = node2->schema->module->ctx;

    diff_ctx = (node1->schema->module->ctx != node2->schema->module->ctx);

    switch (node2->schema->nodetype) {
    case LYS_LEAFLIST:
        if (lyd_leaf_val_equal(node1, node2, diff_ctx) && (!with_defaults || (node1->dflt == node2->dflt))) {
            return 1;
        }
        break;
    case LYS_LIST:
        if (((struct lys_node_list *)node1->schema)->keys_size) {
            /* lists with keys, their equivalence isb ased on their keys */
            elem1 = node1->child;
            elem2 = node2->child;
            elem1_sch = NULL;
            /* the exact data order is guaranteed */
            for (i = 0; i < ((struct lys_node_list *)node1->schema)->keys_size; ++i) {
                if (diff_ctx && elem1) {
                    /* we have different contexts */
                    if (!elem1_sch) {
                        elem1_sch = lyd_get_schema_inctx(elem1, ctx);
                        if (!elem1_sch) {
                            LOGERR(ctx, LY_EINVAL, "Target context does not contain a required schema node (%s:%s).",
                                   lyd_node_module(elem1)->name, elem1->schema->name);
                            return -1;
                        }
                    } else {
                        /* just move to the next schema node */
                        elem1_sch = elem1_sch->next;
                    }
                }
                if (!elem1 || !elem2 || ((elem1_sch ? elem1_sch : elem1->schema) != elem2->schema)
                        || !lyd_leaf_val_equal(elem1, elem2, diff_ctx)) {
                    break;
                }
                elem1 = elem1->next;
                elem2 = elem2->next;
            }
            if (i == ((struct lys_node_list *)node1->schema)->keys_size) {
                return 1;
            }
        } else {
            /* lists wihtout keys, their equivalence is based on values of all the children (both dierct and indirect) */
            if (!node1->child && !node2->child) {
                /* no children, nothing to compare */
                return 1;
            }

            /* status lists without keys, we need to compare all the children :( */

            /* LY_TREE_DFS_BEGIN for 2 data trees */
            elem1 = next1 = node1->child;
            elem2 = next2 = node2->child;
            while (elem1 && elem2) {
                /* node comparison */
#ifdef LY_ENABLED_CACHE
                if (elem1->hash != elem2->hash) {
                    break;
                }
#endif
                if (diff_ctx) {
                    elem1_sch = lyd_get_schema_inctx(elem1, ctx);
                    if (!elem1_sch) {
                        LOGERR(ctx, LY_EINVAL, "Target context does not contain a required schema node (%s:%s).",
                               lyd_node_module(elem1)->name, elem1->schema->name);
                        return -1;
                    }
                } else {
                    elem1_sch = elem1->schema;
                }
                if (elem1_sch != elem2->schema) {
                    break;
                }
                if (elem2->schema->nodetype == LYS_LIST) {
                    if (!lyd_list_has_keys(elem1) && !lyd_list_has_keys(elem2)) {
                        /* we encountered lists without keys (but have some defined in schema), ignore them for comparison */
                        next1 = NULL;
                        next2 = NULL;
                        goto next_sibling;
                    }
                    /* we will compare all the children of this list instance, not just keys */
                } else if (elem2->schema->nodetype & (LYS_LEAFLIST | LYS_LEAF)) {
                    if (!lyd_leaf_val_equal(elem1, elem2, diff_ctx) && (!with_defaults || (elem1->dflt == elem2->dflt))) {
                        break;
                    }
                } else if (elem2->schema->nodetype & LYS_ANYDATA) {
                    if (!lyd_anydata_equal(elem1, elem2)) {
                        break;
                    }
                }

                /* LY_TREE_DFS_END for 2 data trees */
                if (elem2->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
                    next1 = NULL;
                    next2 = NULL;
                } else {
                    next1 = elem1->child;
                    next2 = elem2->child;
                }

next_sibling:
                if (!next1) {
                    next1 = elem1->next;
                }
                if (!next2) {
                    next2 = elem2->next;
                }

                while (!next1) {
                    elem1 = elem1->parent;
                    if (elem1 == node1) {
                        break;
                    }
                    next1 = elem1->next;
                }
                while (!next2) {
                    elem2 = elem2->parent;
                    if (elem2 == node2) {
                        break;
                    }
                    next2 = elem2->next;
                }

                elem1 = next1;
                elem2 = next2;
            }

            if (!elem1 && !elem2) {
                /* all children were successfully compared */
                return 1;
            }
        }
        break;
    default:
        LOGINT(ctx);
        return -1;
    }

    return 0;
}